

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O0

string * __thiscall slang::TextDiagnosticClient::getString_abi_cxx11_(TextDiagnosticClient *this)

{
  string *in_RDI;
  FormatBuffer *in_stack_ffffffffffffffd8;
  
  std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
            ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)0x564909)
  ;
  FormatBuffer::str_abi_cxx11_(in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

std::string TextDiagnosticClient::getString() const {
    return buffer->str();
}